

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_oFFs(png_structrp png_ptr,png_int_32 x_offset,png_int_32 y_offset,int unit_type)

{
  png_byte buf [9];
  
  if (1 < unit_type) {
    png_warning(png_ptr,"Unrecognized unit type for oFFs chunk");
  }
  png_save_int_32(buf,x_offset);
  png_save_int_32(buf + 4,y_offset);
  buf[8] = (png_byte)unit_type;
  png_write_complete_chunk(png_ptr,0x6f464673,buf,9);
  return;
}

Assistant:

void /* PRIVATE */
png_write_oFFs(png_structrp png_ptr, png_int_32 x_offset, png_int_32 y_offset,
    int unit_type)
{
   png_byte buf[9];

   png_debug(1, "in png_write_oFFs");

   if (unit_type >= PNG_OFFSET_LAST)
      png_warning(png_ptr, "Unrecognized unit type for oFFs chunk");

   png_save_int_32(buf, x_offset);
   png_save_int_32(buf + 4, y_offset);
   buf[8] = (png_byte)unit_type;

   png_write_complete_chunk(png_ptr, png_oFFs, buf, (png_size_t)9);
}